

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getAttrDatatypeValidatorNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *localPart,XMLCh *typeURI)

{
  SchemaInfo **enclosingSchema;
  uint saveScope;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  DatatypeValidator *pDVar2;
  SchemaInfo *toRestore_00;
  DOMElement *childElem;
  ListType aListType;
  
  pDVar2 = getDatatypeValidator(this,typeURI,localPart);
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  bVar1 = XMLString::equals(typeURI,this->fTargetNSURIString);
  if (((typeURI == (XMLCh *)0x0) || (bVar1)) || (*typeURI == L'\0')) {
    if (pDVar2 != (DatatypeValidator *)0x0) {
      return pDVar2;
    }
    aListType = INCLUDE;
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,typeURI);
    bVar1 = isImportingNS(this,namespaceURI);
    if (!bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,typeURI,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DatatypeValidator *)0x0;
    }
    if (pDVar2 != (DatatypeValidator *)0x0) {
      return pDVar2;
    }
    toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,namespaceURI);
    if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,typeURI,localPart,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DatatypeValidator *)0x0;
    }
    aListType = IMPORT;
    restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
  }
  childElem = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,localPart,
                         enclosingSchema);
  if (childElem == (DOMElement *)0x0) {
    pDVar2 = (DatatypeValidator *)0x0;
  }
  else {
    pDVar2 = traverseSimpleTypeDecl(this,childElem,true,0);
  }
  if (toRestore != *enclosingSchema) {
    restoreSchemaInfo(this,toRestore,aListType,saveScope);
  }
  return pDVar2;
}

Assistant:

DatatypeValidator*
TraverseSchema::getAttrDatatypeValidatorNS(const DOMElement* const elem,
                                           const XMLCh* localPart,
                                           const XMLCh* typeURI)
{
    DatatypeValidator*   dv = getDatatypeValidator(typeURI, localPart);
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaInfo*          saveInfo = fSchemaInfo;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && (typeURI && *typeURI)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, typeURI);
            return 0;
        }

        if (!dv) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, typeURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    if (!dv) {

        DOMElement* typeElem = fSchemaInfo->getTopLevelComponent
        (
            SchemaInfo::C_SimpleType
            , SchemaSymbols::fgELT_SIMPLETYPE
            , localPart
            , &fSchemaInfo
        );

        if (typeElem)
            dv = traverseSimpleTypeDecl(typeElem);

        // restore schema information, if necessary
        if (saveInfo != fSchemaInfo) {
            restoreSchemaInfo(saveInfo, infoType, saveScope);
        }
    }

    return dv;
}